

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChLinkRevoluteSpherical::Get_react_torque_body1
          (ChVector<double> *__return_storage_ptr__,ChLinkRevoluteSpherical *this)

{
  ChVector<double>::operator-(&(this->super_ChLink).react_torque);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkRevoluteSpherical::Get_react_torque_body1() {
    // Calculate the reaction forces on Body 1 in the joint frame
    // (Note: origin of the joint frame is at the center of the revolute joint
    //  which is defined on body 1, the x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    //  react_torque = (0,m_cur_dist*lam_dot,0)

    return -react_torque;
}